

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_scalar.c
# Opt level: O1

int template_cancreate(t_template *template)

{
  int iVar1;
  t_template *template_00;
  int iVar2;
  t_symbol **pptVar3;
  
  iVar2 = template->t_n;
  if (0 < iVar2) {
    pptVar3 = &template->t_vec->ds_arraytemplate;
    do {
      if ((((t_dataslot *)(pptVar3 + -2))->ds_type == 3) &&
         ((template_00 = template_findbyname(*pptVar3), template_00 == (t_template *)0x0 ||
          (iVar1 = template_cancreate(template_00), iVar1 == 0)))) {
        pd_error((void *)0x0,"%s: no such template",(*pptVar3)->s_name);
        return 0;
      }
      pptVar3 = pptVar3 + 3;
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  return 1;
}

Assistant:

static int template_cancreate(t_template *template)
{
    int i, type, nitems = template->t_n;
    t_dataslot *datatypes = template->t_vec;
    t_template *elemtemplate;
    for (i = 0; i < nitems; i++, datatypes++)
        if (datatypes->ds_type == DT_ARRAY &&
            (!(elemtemplate = template_findbyname(datatypes->ds_arraytemplate))
                || !template_cancreate(elemtemplate)))
    {
        pd_error(0, "%s: no such template", datatypes->ds_arraytemplate->s_name);
        return (0);
    }
    return (1);
}